

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg.cpp
# Opt level: O0

Color __thiscall
CGL::TexTri::color(TexTri *this,Vector3D *p_bary,Vector3D *p_dx_bary,Vector3D *p_dy_bary,
                  SampleParams *sp)

{
  Color CVar1;
  Vector2D local_130;
  Vector2D local_120;
  Vector2D local_110;
  Vector2D local_100;
  undefined1 auStack_f0 [8];
  Vector2D dy_uv;
  Vector2D local_d0;
  Vector2D local_c0;
  Vector2D local_b0;
  undefined1 auStack_a0 [8];
  Vector2D dx_uv;
  Vector2D local_80;
  Vector2D local_70;
  Vector2D local_60;
  undefined1 auStack_50 [8];
  Vector2D uv;
  SampleParams *sp_local;
  Vector3D *p_dy_bary_local;
  Vector3D *p_dx_bary_local;
  Vector3D *p_bary_local;
  TexTri *this_local;
  
  uv.y = (double)sp;
  Vector2D::operator*(&local_70,p_bary->x);
  Vector2D::operator*(&local_80,p_bary->y);
  Vector2D::operator+(&local_60,&local_70);
  Vector2D::operator*((Vector2D *)&dx_uv.y,p_bary->z);
  Vector2D::operator+((Vector2D *)auStack_50,&local_60);
  (sp->p_uv).x = (double)auStack_50;
  (sp->p_uv).y = uv.x;
  Vector2D::operator*(&local_c0,p_dx_bary->x);
  Vector2D::operator*(&local_d0,p_dx_bary->y);
  Vector2D::operator+(&local_b0,&local_c0);
  Vector2D::operator*((Vector2D *)&dy_uv.y,p_dx_bary->z);
  Vector2D::operator+((Vector2D *)auStack_a0,&local_b0);
  (sp->p_dx_uv).x = (double)auStack_a0;
  (sp->p_dx_uv).y = dx_uv.x;
  Vector2D::operator*(&local_110,p_dy_bary->x);
  Vector2D::operator*(&local_120,p_dy_bary->y);
  Vector2D::operator+(&local_100,&local_110);
  Vector2D::operator*(&local_130,p_dy_bary->z);
  Vector2D::operator+((Vector2D *)auStack_f0,&local_100);
  (sp->p_dy_uv).x = (double)auStack_f0;
  (sp->p_dy_uv).y = dy_uv.x;
  CVar1 = Texture::sample(this->tex,sp);
  return CVar1;
}

Assistant:

Color TexTri::color(Vector3D p_bary, Vector3D p_dx_bary, Vector3D p_dy_bary, SampleParams sp) {
  // Part 5: Fill this in with bilinear sampling.
    Vector2D uv = this->p0_uv * p_bary.x + this->p1_uv * p_bary.y + this->p2_uv * p_bary.z;
    sp.p_uv = uv;
    Vector2D dx_uv = this->p0_uv * p_dx_bary.x + this->p1_uv * p_dx_bary.y + this->p2_uv * p_dx_bary.z;
    sp.p_dx_uv = dx_uv;
    Vector2D dy_uv = this->p0_uv * p_dy_bary.x + this->p1_uv * p_dy_bary.y + this->p2_uv * p_dy_bary.z;
    sp.p_dy_uv = dy_uv;
    
    return this->tex->sample(sp);
  // Part 6: Fill this in with trilinear sampling as well.
}